

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O0

float ncnn::compute_coord(float sx,int w,int padding_mode,int align_corner)

{
  float in_EDX;
  float in_ESI;
  float in_XMM0_Da;
  undefined4 local_4;
  
  if (in_ESI == 2.8026e-45) {
    local_4 = border_coord(2.8026e-45,in_EDX);
  }
  else {
    local_4 = in_XMM0_Da;
    if (in_ESI == 4.2039e-45) {
      if (in_EDX == 0.0) {
        reflect_coord(4.2039e-45,0);
        local_4 = border_coord(in_ESI,in_EDX);
      }
      else {
        local_4 = reflect_coord(4.2039e-45,(int)in_EDX);
      }
    }
  }
  return local_4;
}

Assistant:

static float compute_coord(float sx, int w, int padding_mode, int align_corner)
{
    if (padding_mode == 2) // border
    {
        sx = border_coord(sx, w - 1);
    }
    else if (padding_mode == 3) // reflection
    {
        if (align_corner)
        {
            sx = reflect_coord(sx, w - 1);
        }
        else
        {
            sx = reflect_coord(sx + 0.5, w) - 0.5;
            sx = border_coord(sx, w - 1);
        }
    }

    return sx;
}